

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O2

int __thiscall Fl_Tabs::tab_positions(Fl_Tabs *this)

{
  size_t __size;
  uint uVar1;
  int *piVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  Fl_Widget **ppFVar7;
  long lVar8;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int wt;
  int ht;
  int local_3c;
  uint local_38;
  int local_34;
  long lVar9;
  
  uVar1 = (this->super_Fl_Group).children_;
  lVar12 = (long)(int)uVar1;
  if (uVar1 != this->tab_count) {
    clear_tab_positions(this);
    if (uVar1 != 0) {
      __size = lVar12 * 4 + 4;
      piVar6 = (int *)malloc(__size);
      this->tab_pos = piVar6;
      piVar6 = (int *)malloc(__size);
      this->tab_width = piVar6;
    }
    this->tab_count = uVar1;
  }
  if (uVar1 == 0) {
    iVar4 = 0;
  }
  else {
    ppFVar7 = Fl_Group::array(&this->super_Fl_Group);
    cVar3 = fl_draw_shortcut;
    fl_draw_shortcut = '\x01';
    iVar4 = Fl::box_dx((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
    piVar6 = this->tab_pos;
    uVar11 = 0;
    uVar13 = 0;
    if (0 < (int)uVar1) {
      uVar13 = (ulong)uVar1;
    }
    *piVar6 = iVar4;
    iVar4 = 0;
    local_38 = uVar1;
    for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
      if ((ppFVar7[uVar11]->flags_ & 2) == 0) {
        iVar4 = (int)uVar11;
      }
      local_3c = 0;
      local_34 = 0;
      Fl_Label::measure(&ppFVar7[uVar11]->label_,&local_3c,&local_34);
      this->tab_width[uVar11] = local_3c + 10;
      piVar6 = this->tab_pos;
      piVar6[uVar11 + 1] = local_3c + piVar6[uVar11] + 0xc;
    }
    iVar5 = (this->super_Fl_Group).super_Fl_Widget.w_;
    fl_draw_shortcut = cVar3;
    if (iVar5 < piVar6[uVar13]) {
      piVar6[uVar13] = iVar5;
      piVar2 = this->tab_width;
      lVar9 = lVar12;
      while (lVar8 = lVar9 + -1, lVar9 != 0) {
        iVar10 = iVar5 - piVar2[lVar8];
        if (piVar6[lVar9] < iVar10) {
          iVar10 = piVar6[lVar9];
        }
        if (piVar6[lVar8] <= iVar10) break;
        piVar6[lVar8] = iVar10;
        iVar5 = iVar5 + -10;
        lVar9 = lVar8;
      }
      piVar2 = this->tab_width;
      iVar5 = 0;
      for (uVar11 = 0; (uVar13 != uVar11 && (piVar6[uVar11] < iVar5)); uVar11 = uVar11 + 1) {
        piVar6[uVar11] = iVar5;
        iVar10 = (this->super_Fl_Group).super_Fl_Widget.w_ + local_38 * -10 + -1;
        if (iVar10 < piVar2[uVar11]) {
          piVar2[uVar11] = iVar10;
        }
        iVar5 = iVar5 + 10;
      }
      piVar2 = this->tab_width;
      for (; iVar4 < lVar12; lVar12 = lVar12 + -1) {
        piVar6[lVar12] = piVar2[lVar12 + -1] + piVar6[lVar12 + -1];
      }
    }
  }
  return iVar4;
}

Assistant:

int Fl_Tabs::tab_positions() {
  const int nc = children();
  if (nc != tab_count) {
    clear_tab_positions();
    if (nc) {
      tab_pos   = (int*)malloc((nc+1)*sizeof(int));
      tab_width = (int*)malloc((nc+1)*sizeof(int));
    }
    tab_count = nc;
  }
  if (nc == 0) return 0;
  int selected = 0;
  Fl_Widget*const* a = array();
  int i;
  char prev_draw_shortcut = fl_draw_shortcut;
  fl_draw_shortcut = 1;

  tab_pos[0] = Fl::box_dx(box());
  for (i=0; i<nc; i++) {
    Fl_Widget* o = *a++;
    if (o->visible()) selected = i;

    int wt = 0; int ht = 0;
    o->measure_label(wt,ht);

    tab_width[i] = wt + EXTRASPACE;
    tab_pos[i+1] = tab_pos[i] + tab_width[i] + BORDER;
  }
  fl_draw_shortcut = prev_draw_shortcut;

  int r = w();
  if (tab_pos[i] <= r) return selected;
  // uh oh, they are too big:
  // pack them against right edge:
  tab_pos[i] = r;
  for (i = nc; i--;) {
    int l = r-tab_width[i];
    if (tab_pos[i+1] < l) l = tab_pos[i+1];
    if (tab_pos[i] <= l) break;
    tab_pos[i] = l;
    r -= EXTRASPACE;
  }
  // pack them against left edge and truncate width if they still don't fit:
  for (i = 0; i<nc; i++) {
    if (tab_pos[i] >= i*EXTRASPACE) break;
    tab_pos[i] = i*EXTRASPACE;
    int W = w()-1-EXTRASPACE*(nc-i) - tab_pos[i];
    if (tab_width[i] > W) tab_width[i] = W;
  }
  // adjust edges according to visiblity:
  for (i = nc; i > selected; i--) {
    tab_pos[i] = tab_pos[i-1] + tab_width[i-1];
  }
  return selected;
}